

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Extent.hpp
# Opt level: O0

bool __thiscall Parfait::Extent<double>::contains(Extent<double> *this,Extent<double> *box)

{
  double dVar1;
  double *pdVar2;
  uint local_24;
  uint i;
  Extent<double> *box_local;
  Extent<double> *this_local;
  
  local_24 = 0;
  while( true ) {
    if (2 < local_24) {
      return true;
    }
    pdVar2 = Point<double>::operator[](&box->hi,local_24);
    dVar1 = *pdVar2;
    pdVar2 = Point<double>::operator[](&this->lo,local_24);
    if (dVar1 < *pdVar2) break;
    pdVar2 = Point<double>::operator[](&box->lo,local_24);
    dVar1 = *pdVar2;
    pdVar2 = Point<double>::operator[](&this->hi,local_24);
    if (*pdVar2 <= dVar1 && dVar1 != *pdVar2) {
      return false;
    }
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

bool Extent<T>::contains(const Extent<T> &box) const {
    for (unsigned int i = 0; i < 3; i++) {
      if (box.hi[i] < lo[i]) {
        return false;
      }
      if (box.lo[i] > hi[i]) {
        return false;
      }
    }
    return true;
  }